

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementEffects.cpp
# Opt level: O0

void __thiscall Rml::ElementEffects::RenderEffects(ElementEffects *this,RenderStage render_stage)

{
  pointer *this_00;
  Span<const_unsigned_long> filters;
  pointer puVar1;
  Vector2Type VVar2;
  bool bVar3;
  size_type sVar4;
  reference this_01;
  element_type *peVar5;
  LayerHandle LVar6;
  LayerHandle LVar7;
  Rectanglei new_region;
  Span<const_unsigned_long> local_160;
  undefined1 local_150 [24];
  DecoratorEntry *mask_image;
  reference pFStack_130;
  int i_1;
  FilterEntry *filter_1;
  iterator __end4;
  iterator __begin4;
  FilterEntryList *__range4;
  FilterHandleList filter_handles_1;
  CompiledFilter mask_image_filter;
  Span<const_unsigned_long> local_d8;
  Span<const_unsigned_long> local_c8 [2];
  reference local_a8;
  FilterEntry *filter;
  iterator __end3;
  iterator __begin3;
  FilterEntryList *__range3;
  FilterHandleList filter_handles;
  LayerHandle backdrop_temp_layer;
  LayerHandle backdrop_destination_layer;
  LayerHandle backdrop_source_layer;
  anon_class_16_2_3014caff ApplyScissorRegionForBackdrop;
  anon_class_16_2_3014caff ApplyClippingRegion;
  Rectanglei initial_scissor_region;
  RenderManager *render_manager;
  DecoratorEntry *decorator;
  int i;
  RenderStage render_stage_local;
  ElementEffects *this_local;
  
  InstanceEffects(this);
  ReloadEffectsData(this);
  bVar3 = ::std::
          vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
          ::empty(&this->decorators);
  if ((!bVar3) && (render_stage == Decoration)) {
    sVar4 = ::std::
            vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
            ::size(&this->decorators);
    decorator._0_4_ = (int)sVar4;
    while (decorator._0_4_ = (int)decorator + -1, -1 < (int)decorator) {
      this_01 = ::std::
                vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                ::operator[](&this->decorators,(long)(int)decorator);
      if (this_01->decorator_data != 0) {
        peVar5 = ::std::
                 __shared_ptr_access<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this_01);
        (*peVar5->_vptr_Decorator[4])(peVar5,this->element,this_01->decorator_data);
      }
    }
  }
  bVar3 = ::std::
          vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
          ::empty(&this->filters);
  if ((((!bVar3) ||
       (bVar3 = ::std::
                vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                ::empty(&this->backdrop_filters), !bVar3)) ||
      (bVar3 = ::std::
               vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
               ::empty(&this->mask_images), !bVar3)) &&
     (initial_scissor_region.p1 = (Vector2Type)Element::GetRenderManager(this->element),
     initial_scissor_region.p1 != (Vector2Type)0x0)) {
    new_region = RenderManager::GetScissorRegion((RenderManager *)initial_scissor_region.p1);
    ApplyScissorRegionForBackdrop.this = (ElementEffects *)&initial_scissor_region.p1;
    backdrop_source_layer = (LayerHandle)this;
    ApplyScissorRegionForBackdrop.render_manager = (RenderManager **)this;
    if (render_stage == Enter) {
      LVar6 = RenderManager::GetTopLayer((RenderManager *)initial_scissor_region.p1);
      bVar3 = ::std::
              vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
              ::empty(&this->filters);
      if ((!bVar3) ||
         (bVar3 = ::std::
                  vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                  ::empty(&this->mask_images), !bVar3)) {
        RenderManager::PushLayer((RenderManager *)initial_scissor_region.p1);
      }
      bVar3 = ::std::
              vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
              ::empty(&this->backdrop_filters);
      if (!bVar3) {
        LVar7 = RenderManager::GetTopLayer((RenderManager *)initial_scissor_region.p1);
        RenderEffects::anon_class_16_2_3014caff::operator()
                  ((anon_class_16_2_3014caff *)&backdrop_source_layer);
        RenderManager::PushLayer((RenderManager *)initial_scissor_region.p1);
        filter_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)RenderManager::GetTopLayer((RenderManager *)initial_scissor_region.p1);
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3);
        __end3 = ::std::
                 vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                 ::begin(&this->backdrop_filters);
        filter = (FilterEntry *)
                 ::std::
                 vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                 ::end(&this->backdrop_filters);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<Rml::ElementEffects::FilterEntry_*,_std::vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>_>
                                           *)&filter), VVar2 = initial_scissor_region.p1,
              puVar1 = filter_handles.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage, bVar3) {
          local_a8 = __gnu_cxx::
                     __normal_iterator<Rml::ElementEffects::FilterEntry_*,_std::vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>_>
                     ::operator*(&__end3);
          CompiledFilter::AddHandleTo(&local_a8->compiled,(FilterHandleList *)&__range3);
          __gnu_cxx::
          __normal_iterator<Rml::ElementEffects::FilterEntry_*,_std::vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>_>
          ::operator++(&__end3);
        }
        Span<const_unsigned_long>::Span
                  (local_c8,(Vector<typename_std::remove_const_t<const_unsigned_long>_> *)&__range3)
        ;
        RenderManager::CompositeLayers
                  ((RenderManager *)VVar2,LVar6,(LayerHandle)puVar1,Blend,local_c8[0]);
        RenderEffects::anon_class_16_2_3014caff::operator()
                  ((anon_class_16_2_3014caff *)&ApplyScissorRegionForBackdrop.render_manager,
                   BackdropFilter);
        VVar2 = initial_scissor_region.p1;
        puVar1 = filter_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_d8.m_data = (unsigned_long *)0x0;
        local_d8.m_size = 0;
        Span<const_unsigned_long>::Span(&local_d8);
        filters.m_size = local_d8.m_size;
        filters.m_data = local_d8.m_data;
        RenderManager::CompositeLayers
                  ((RenderManager *)VVar2,(LayerHandle)puVar1,LVar7,Blend,filters);
        RenderManager::PopLayer((RenderManager *)initial_scissor_region.p1);
        RenderManager::SetScissorRegion((RenderManager *)initial_scissor_region.p1,new_region);
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3);
      }
    }
    else if ((render_stage == Exit) &&
            ((bVar3 = ::std::
                      vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                      ::empty(&this->filters), !bVar3 ||
             (bVar3 = ::std::
                      vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                      ::empty(&this->mask_images), !bVar3)))) {
      RenderEffects::anon_class_16_2_3014caff::operator()
                ((anon_class_16_2_3014caff *)&ApplyScissorRegionForBackdrop.render_manager,Filter);
      CompiledFilter::CompiledFilter
                ((CompiledFilter *)
                 &filter_handles_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
      sVar4 = ::std::
              vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
              ::size(&this->filters);
      bVar3 = ::std::
              vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
              ::empty(&this->mask_images);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4,sVar4 + !bVar3);
      __end4 = ::std::
               vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
               ::begin(&this->filters);
      filter_1 = (FilterEntry *)
                 ::std::
                 vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                 ::end(&this->filters);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<Rml::ElementEffects::FilterEntry_*,_std::vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>_>
                                         *)&filter_1), bVar3) {
        pFStack_130 = __gnu_cxx::
                      __normal_iterator<Rml::ElementEffects::FilterEntry_*,_std::vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>_>
                      ::operator*(&__end4);
        CompiledFilter::AddHandleTo(&pFStack_130->compiled,(FilterHandleList *)&__range4);
        __gnu_cxx::
        __normal_iterator<Rml::ElementEffects::FilterEntry_*,_std::vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>_>
        ::operator++(&__end4);
      }
      bVar3 = ::std::
              vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
              ::empty(&this->mask_images);
      if (!bVar3) {
        RenderManager::PushLayer((RenderManager *)initial_scissor_region.p1);
        sVar4 = ::std::
                vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                ::size(&this->mask_images);
        mask_image._4_4_ = (int)sVar4;
        while (mask_image._4_4_ = mask_image._4_4_ + -1, -1 < mask_image._4_4_) {
          local_150._16_8_ =
               ::std::
               vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
               ::operator[](&this->mask_images,(long)mask_image._4_4_);
          if ((((pointer)local_150._16_8_)->mesh).vertices.
              super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            peVar5 = ::std::
                     __shared_ptr_access<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_150._16_8_);
            (*peVar5->_vptr_Decorator[4])
                      (peVar5,this->element,
                       (((Mesh *)local_150._16_8_)->vertices).
                       super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
          }
        }
        RenderManager::SaveLayerAsMaskImage((RenderManager *)local_150);
        this_00 = &filter_handles_1.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        CompiledFilter::operator=((CompiledFilter *)this_00,(CompiledFilter *)local_150);
        CompiledFilter::~CompiledFilter((CompiledFilter *)local_150);
        CompiledFilter::AddHandleTo((CompiledFilter *)this_00,(FilterHandleList *)&__range4);
        RenderManager::PopLayer((RenderManager *)initial_scissor_region.p1);
      }
      VVar2 = initial_scissor_region.p1;
      LVar6 = RenderManager::GetTopLayer((RenderManager *)initial_scissor_region.p1);
      LVar7 = RenderManager::GetNextLayer((RenderManager *)initial_scissor_region.p1);
      Span<const_unsigned_long>::Span
                (&local_160,(Vector<typename_std::remove_const_t<const_unsigned_long>_> *)&__range4)
      ;
      RenderManager::CompositeLayers((RenderManager *)VVar2,LVar6,LVar7,Blend,local_160);
      RenderManager::PopLayer((RenderManager *)initial_scissor_region.p1);
      RenderManager::SetScissorRegion((RenderManager *)initial_scissor_region.p1,new_region);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
      CompiledFilter::~CompiledFilter
                ((CompiledFilter *)
                 &filter_handles_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  return;
}

Assistant:

void ElementEffects::RenderEffects(RenderStage render_stage)
{
	InstanceEffects();
	ReloadEffectsData();

	if (!decorators.empty())
	{
		if (render_stage == RenderStage::Decoration)
		{
			// Render the decorators attached to this element in its current state.
			// Render from back to front for correct render order.
			for (int i = (int)decorators.size() - 1; i >= 0; i--)
			{
				DecoratorEntry& decorator = decorators[i];
				if (decorator.decorator_data)
					decorator.decorator->RenderElement(element, decorator.decorator_data);
			}
		}
	}

	if (filters.empty() && backdrop_filters.empty() && mask_images.empty())
		return;

	RenderManager* render_manager = element->GetRenderManager();
	if (!render_manager)
		return;

	Rectanglei initial_scissor_region = render_manager->GetScissorRegion();

	auto ApplyClippingRegion = [this, &render_manager](PropertyId filter_id) {
		RMLUI_ASSERT(filter_id == PropertyId::Filter || filter_id == PropertyId::BackdropFilter);

		const bool force_clip_to_self_border_box = (filter_id == PropertyId::BackdropFilter);
		ElementUtilities::SetClippingRegion(element, force_clip_to_self_border_box);

		// Find the region being affected by the active filters and apply it as a scissor.
		Rectanglef filter_region = Rectanglef::MakeInvalid();
		ElementUtilities::GetBoundingBox(filter_region, element, force_clip_to_self_border_box ? BoxArea::Border : BoxArea::Auto);

		// The filter property may draw outside our normal clipping region due to ink overflow.
		if (filter_id == PropertyId::Filter)
		{
			for (const auto& filter : filters)
				filter.filter->ExtendInkOverflow(element, filter_region);
		}

		Math::ExpandToPixelGrid(filter_region);

		Rectanglei scissor_region = Rectanglei(filter_region).IntersectIfValid(render_manager->GetScissorRegion());
		render_manager->SetScissorRegion(scissor_region);
	};
	auto ApplyScissorRegionForBackdrop = [this, &render_manager]() {
		// Set the scissor region for backdrop drawing, which covers the element's border box plus any area we may need
		// to read from, such as any blur radius.
		Rectanglef filter_region = Rectanglef::MakeInvalid();
		ElementUtilities::GetBoundingBox(filter_region, element, BoxArea::Border);
		for (const auto& filter : backdrop_filters)
			filter.filter->ExtendInkOverflow(element, filter_region);
		Math::ExpandToPixelGrid(filter_region);
		render_manager->SetScissorRegion(Rectanglei(filter_region));
	};

	if (render_stage == RenderStage::Enter)
	{
		const LayerHandle backdrop_source_layer = render_manager->GetTopLayer();

		if (!filters.empty() || !mask_images.empty())
		{
			render_manager->PushLayer();
		}

		if (!backdrop_filters.empty())
		{
			const LayerHandle backdrop_destination_layer = render_manager->GetTopLayer();

			// @performance We strictly only need this temporary buffer when having to read from outside the element
			// boundaries, which currently only applies to blur and drop-shadow. Alternatively, we could avoid this
			// completely if we introduced a render interface API concept of different input and output clipping. That
			// is, we set a large input scissor to cover all input data, which can be used e.g. during blurring, and use
			// our small border-area-only clipping region for the composite layers output.
			ApplyScissorRegionForBackdrop();
			render_manager->PushLayer();
			const LayerHandle backdrop_temp_layer = render_manager->GetTopLayer();

			FilterHandleList filter_handles;
			for (auto& filter : backdrop_filters)
				filter.compiled.AddHandleTo(filter_handles);

			// Render the backdrop filters in the extended scissor region including any ink overflow.
			render_manager->CompositeLayers(backdrop_source_layer, backdrop_temp_layer, BlendMode::Blend, filter_handles);

			// Then composite the filter output to our destination while applying our clipping region, including any border-radius.
			ApplyClippingRegion(PropertyId::BackdropFilter);
			render_manager->CompositeLayers(backdrop_temp_layer, backdrop_destination_layer, BlendMode::Blend, {});
			render_manager->PopLayer();
			render_manager->SetScissorRegion(initial_scissor_region);
		}
	}
	else if (render_stage == RenderStage::Exit)
	{
		if (!filters.empty() || !mask_images.empty())
		{
			ApplyClippingRegion(PropertyId::Filter);

			CompiledFilter mask_image_filter;
			FilterHandleList filter_handles;
			filter_handles.reserve(filters.size() + (mask_images.empty() ? 0 : 1));

			for (auto& filter : filters)
				filter.compiled.AddHandleTo(filter_handles);

			if (!mask_images.empty())
			{
				render_manager->PushLayer();

				for (int i = (int)mask_images.size() - 1; i >= 0; i--)
				{
					DecoratorEntry& mask_image = mask_images[i];
					if (mask_image.decorator_data)
						mask_image.decorator->RenderElement(element, mask_image.decorator_data);
				}
				mask_image_filter = render_manager->SaveLayerAsMaskImage();
				mask_image_filter.AddHandleTo(filter_handles);
				render_manager->PopLayer();
			}

			render_manager->CompositeLayers(render_manager->GetTopLayer(), render_manager->GetNextLayer(), BlendMode::Blend, filter_handles);
			render_manager->PopLayer();
			render_manager->SetScissorRegion(initial_scissor_region);
		}
	}
}